

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderProgramResource.cpp
# Opt level: O2

bool __thiscall
glcts::GeometryShaderProgramResourceTest::checkIfResourceIsReferenced
          (GeometryShaderProgramResourceTest *this,GLuint program_object_id,GLenum interface,
          char *name)

{
  bool bVar1;
  int iVar2;
  GLuint index;
  undefined4 extraout_var;
  GLenum program_object_id_00;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  program_object_id_00 = interface;
  index = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x9a8))(program_object_id,interface,name);
  if (index != 0xffffffff) {
    bVar1 = checkIfResourceAtIndexIsReferenced(this,program_object_id_00,interface,index);
    return bVar1;
  }
  return false;
}

Assistant:

bool GeometryShaderProgramResourceTest::checkIfResourceIsReferenced(glw::GLuint program_object_id,
																	glw::GLenum interface, const char* name) const
{
	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Resource index */
	glw::GLuint index = GL_INVALID_INDEX;

	/* Get resource's index by name */
	index = gl.getProgramResourceIndex(program_object_id, interface, name);

	/**
	 *     Otherwise, <name> is considered not to be the name
	 *     of an active resource, and INVALID_INDEX is returned.
	 **/
	if (GL_INVALID_INDEX == index)
	{
		return false;
	}

	/* Get property by index */
	return checkIfResourceAtIndexIsReferenced(program_object_id, interface, index);
}